

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

bool __thiscall Clasp::mt::ParallelSolve::requestWork(ParallelSolve *this,Solver *s,PathPtr *out)

{
  uint uVar1;
  bool bVar2;
  LitVec *x;
  int iVar3;
  
  x = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0;
  iVar3 = 0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar1 = (this->shared_->control).super___atomic_base<unsigned_int>._M_i;
          if ((uVar1 & 1) != 0) goto LAB_0017535c;
          if ((iVar3 != 0) ||
             (bVar2 = Solver::popRootLevel(s,(s->levels_).root,(LitVec *)0x0,true), bVar2)) break;
          terminate(this,s,true);
          iVar3 = 1;
        }
        iVar3 = iVar3 + 1;
        if (((this->shared_->control).super___atomic_base<unsigned_int>._M_i & 2) == 0) break;
        waitOnSync(this,s);
      }
      if ((x != (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0) ||
         (x = SharedData::requestWork(this->shared_,s), x != (LitVec *)0x0)) break;
      x = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0;
      if (((this->shared_->control).super___atomic_base<unsigned_int>._M_i & 2) == 0) {
        terminate(this,s,true);
        x = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0;
      }
    }
    SingleOwnerPtr<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
    ::reset(out,x);
    if (x == this->shared_->path) {
      *(byte *)&out->ptr_ = (byte)out->ptr_ & 0xfe;
    }
    bVar2 = Solver::simplify(s);
    iVar3 = 0;
  } while (!bVar2);
LAB_0017535c:
  return (uVar1 & 1) == 0;
}

Assistant:

bool ParallelSolve::requestWork(Solver& s, PathPtr& out) {
	const LitVec* a = 0;
	for (int popped = 0; !shared_->terminate();) {
		// only clear path and stop conflict - we don't propagate() here
		// because we would then have to handle any eventual conflicts
		if (++popped == 1 && !s.popRootLevel(s.rootLevel())) {
			// s has a real top-level conflict - problem is unsat
			terminate(s, true);
		}
		else if (shared_->synchronize()) {
			// a synchronize request is active - we are fine with
			// this but did not yet have a chance to react on it
			waitOnSync(s);
		}
		else if (a || (a = shared_->requestWork(s)) != 0) {
			assert(s.decisionLevel() == 0);
			// got new work from work-queue
			out = a;
			// do not take over ownership of initial gp!
			if (a == shared_->path) { out.release(); }
			// propagate any new facts before starting new work
			if (s.simplify())       { return true; }
			// s now has a conflict - either an artificial stop conflict
			// or a real conflict - we'll handle it in the next iteration
			// via the call to popRootLevel()
			popped = 0;
		}
		else if (!shared_->synchronize()) {
			// no work left - quitting time?
			terminate(s, true);
		}
	}
	return false;
}